

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPM2B_ECC_POINT_Marshal(TPM2B_ECC_POINT *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  BYTE *sizeField;
  UINT16 local_22;
  BYTE *local_20;
  
  local_20 = *buffer;
  *buffer = local_20 + 2;
  UVar1 = TPMS_ECC_POINT_Marshal(&source->point,buffer,size);
  local_22 = UVar1;
  UINT16_Marshal(&local_22,&local_20,size);
  return UVar1 + 2;
}

Assistant:

UINT16
TPM2B_ECC_POINT_Marshal(TPM2B_ECC_POINT *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    BYTE      *sizeField = *buffer;
    // Advance buffer pointer by canonical size of a UINT16
    *buffer += 2;
    // Marshal the structure
    result = (UINT16)(result + TPMS_ECC_POINT_Marshal((TPMS_ECC_POINT *)&(source->point), buffer, size));
    // Marshal the size
    result = (UINT16)(result + UINT16_Marshal(&result, &sizeField, size));
    return result;
}